

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint64_t helper_neon_qrshl_u64_aarch64(CPUARMState_conflict *env,uint64_t val,uint64_t shiftop)

{
  ulong uVar1;
  byte bVar2;
  
  bVar2 = (byte)shiftop;
  if ((char)bVar2 < '@') {
    if ((char)bVar2 < -0x40) {
      return 0;
    }
    if (((uint)shiftop & 0xff) == 0xc0) {
      return val >> 0x3f;
    }
    if ((char)bVar2 < '\0') {
      uVar1 = val >> (~bVar2 & 0x3f);
      if (uVar1 != 0xffffffffffffffff) {
        return uVar1 + 1 >> 1;
      }
      return 0x8000000000000000;
    }
    uVar1 = val << (bVar2 & 0x3f);
    if (uVar1 >> (bVar2 & 0x3f) == val) {
      return uVar1;
    }
  }
  else if (val == 0) {
    return 0;
  }
  (env->vfp).qc[0] = 1;
  return 0xffffffffffffffff;
}

Assistant:

uint64_t HELPER(neon_qrshl_u64)(CPUARMState *env, uint64_t val, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = ~0;
        }
    } else if (shift < -64) {
        val = 0;
    } else if (shift == -64) {
        val >>= 63;
    } else if (shift < 0) {
        val >>= (-shift - 1);
        if (val == UINT64_MAX) {
            /* In this case, it means that the rounding constant is 1,
             * and the addition would overflow. Return the actual
             * result directly.  */
            val = 0x8000000000000000ULL;
        } else {
            val++;
            val >>= 1;
        }
    } else { \
        uint64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = ~0;
        }
    }
    return val;
}